

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaAddSchemaDoc
              (xmlSchemaParserCtxtPtr pctxt,int type,xmlChar *schemaLocation,xmlDocPtr schemaDoc,
              char *schemaBuffer,int schemaBufferLen,xmlNodePtr invokingNode,
              xmlChar *sourceTargetNamespace,xmlChar *importNamespace,
              xmlSchemaBucketPtr_conflict *bucket)

{
  xmlElementType xVar1;
  xmlDictPtr dict;
  xmlSchemaPtr pxVar2;
  xmlSchemaConstructionCtxtPtr pxVar3;
  xmlSchemaSchemaRelationPtr_conflict pxVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  xmlParserCtxtPtr ctxt;
  xmlError *pxVar9;
  xmlNodePtr node;
  byte *pbVar10;
  _xmlNode *p_Var11;
  xmlSchemaSchemaRelationPtr pxVar12;
  xmlSchemaItemListPtr pxVar13;
  xmlSchemaSchemaRelationPtr_conflict pxVar14;
  xmlChar *pxVar15;
  xmlSchemaBucketPtr_conflict bucket_00;
  xmlSchemaBucketPtr_conflict pxVar16;
  xmlSchemaPtr pxVar17;
  xmlHashTablePtr pxVar18;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  xmlNodePtr cur;
  xmlSchemaParserCtxtPtr pxVar19;
  xmlParserErrors xVar20;
  char *pcVar21;
  ulong uVar22;
  xmlNode *cur_00;
  xmlChar *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff70;
  xmlDocPtr local_60;
  xmlChar *local_58;
  xmlChar *local_48;
  
  if (bucket != (xmlSchemaBucketPtr_conflict *)0x0) {
    *bucket = (xmlSchemaBucketPtr_conflict)0x0;
  }
  if (type == 0) {
LAB_0018e3d4:
    pxVar12 = (xmlSchemaSchemaRelationPtr)0x0;
    bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
    local_48 = (xmlChar *)0x0;
LAB_0018e3e2:
    pxVar19 = pctxt;
    if (schemaDoc == (xmlDocPtr)0x0) {
      if (schemaBuffer != (char *)0x0 || schemaLocation != (xmlChar *)0x0) {
        pcVar21 = schemaBuffer;
        ctxt = xmlNewParserCtxt();
        local_58 = schemaLocation;
        if (ctxt == (xmlParserCtxtPtr)0x0) {
          local_60 = (xmlDocPtr)0x0;
          pcVar21 = (char *)0x0;
          xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0x10,
                              (xmlError *)0x0);
          iVar8 = 0;
          iVar7 = 5;
        }
        else {
          if (pctxt->serror != (xmlStructuredErrorFunc)0x0) {
            xmlCtxtSetErrorHandler(ctxt,pctxt->serror,pctxt->errCtxt);
          }
          if (pctxt->resourceLoader != (xmlResourceLoader)0x0) {
            xmlCtxtSetResourceLoader(ctxt,pctxt->resourceLoader,pctxt->resourceCtxt);
          }
          if ((pctxt->dict != (xmlDictPtr)0x0) && (ctxt->dict != (xmlDictPtr)0x0)) {
            xmlDictFree(ctxt->dict);
            dict = pctxt->dict;
            ctxt->dict = dict;
            xmlDictReference(dict);
          }
          if (schemaLocation == (xmlChar *)0x0) {
            if (schemaBuffer == (char *)0x0) {
              local_60 = (xmlDocPtr)0x0;
              local_58 = (xmlChar *)0x0;
            }
            else {
              pcVar21 = (char *)0x0;
              local_60 = xmlCtxtReadMemory(ctxt,schemaBuffer,schemaBufferLen,(char *)0x0,(char *)0x0
                                           ,2);
              if (local_60 == (xmlDocPtr)0x0) {
                local_58 = "in_memory_buffer";
                local_60 = (xmlDocPtr)0x0;
              }
              else {
                local_58 = "in_memory_buffer";
                pxVar15 = xmlStrdup((xmlChar *)"in_memory_buffer");
                local_60->URL = pxVar15;
              }
            }
          }
          else {
            local_60 = xmlCtxtReadFile(ctxt,(char *)schemaLocation,(char *)0x0,2);
          }
          bVar6 = 0;
          iVar7 = 0;
          if (local_60 == (xmlDocPtr)0x0) {
            pxVar9 = xmlGetLastError();
            if (pxVar9 != (xmlError *)0x0) {
              bVar6 = 0;
              iVar7 = 0;
              if (pxVar9->domain == 8) goto LAB_0018e553;
            }
            pcVar21 = "Failed to parse the XML resource \'%s\'";
            xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_SRC_IMPORT_2_1,
                                invokingNode,(xmlSchemaBasicItemPtr)0x0,
                                "Failed to parse the XML resource \'%s\'",local_58,(xmlChar *)0x0,
                                (xmlChar *)0x0,(xmlChar *)0x0);
            iVar7 = 1;
            bVar6 = 1;
          }
LAB_0018e553:
          xmlFreeParserCtxt(ctxt);
          bVar5 = (bool)(local_60 == (xmlDocPtr)0x0 & bVar6);
          iVar8 = 1;
          if (!bVar5) {
            iVar8 = iVar7;
          }
          iVar7 = 0;
          if (bVar5) {
            iVar7 = 6;
          }
        }
        if (iVar7 == 0) {
          bVar5 = false;
          schemaBuffer = pcVar21;
          goto LAB_0018e59f;
        }
        bVar5 = false;
        if (iVar7 == 5) goto LAB_0018e798;
        if (iVar7 != 6) goto LAB_0018ee66;
LAB_0018e9b3:
        if (((local_60 != (xmlDocPtr)0x0) && (!bVar5)) &&
           (xmlFreeDoc(local_60), bucket_00 != (xmlSchemaBucketPtr_conflict)0x0)) {
          bucket_00->doc = (xmlDocPtr)0x0;
        }
        pxVar19 = (xmlSchemaParserCtxtPtr)(ulong)(uint)pctxt->err;
        goto LAB_0018ee66;
      }
      xmlSchemaPErrFull(pctxt,(xmlNodePtr)0x0,0x6de,XML_ERR_ERROR,schemaBuffer,schemaBufferLen,
                        (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,in_stack_ffffffffffffff70,
                        "No information for parsing was provided with the given schema parser context.\n"
                        ,0,0);
LAB_0018e796:
      local_60 = (xmlDocPtr)0x0;
LAB_0018e798:
      bVar5 = false;
LAB_0018ee46:
      pxVar19 = (xmlSchemaParserCtxtPtr)0xffffffff;
      if (((local_60 != (xmlDocPtr)0x0) && (!bVar5)) &&
         (xmlFreeDoc(local_60), bucket_00 != (xmlSchemaBucketPtr_conflict)0x0)) {
        bucket_00->doc = (xmlDocPtr)0x0;
      }
      goto LAB_0018ee66;
    }
    bVar5 = true;
    iVar8 = 0;
    local_60 = schemaDoc;
    if (schemaDoc->URL == (xmlChar *)0x0) {
      local_58 = "in_memory_buffer";
    }
    else {
      local_58 = xmlDictLookup(pctxt->dict,schemaDoc->URL,-1);
    }
LAB_0018e59f:
    if (local_60 != (xmlDoc *)0x0) {
      node = xmlDocGetRootElement(local_60);
      if (node == (xmlNodePtr)0x0) {
        schemaBuffer = "The document \'%s\' has no document element";
        xVar20 = XML_SCHEMAP_NOROOT;
LAB_0018e7be:
        xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pctxt,xVar20,invokingNode,
                            (xmlSchemaBasicItemPtr)0x0,schemaBuffer,local_58,(xmlChar *)0x0,
                            (xmlChar *)0x0,(xmlChar *)0x0);
        iVar7 = 6;
      }
      else {
        cur_00 = (xmlNodePtr)0x0;
        cur = node;
        do {
          if (cur_00 != (xmlNodePtr)0x0) {
            xmlUnlinkNode(cur_00);
            xmlFreeNode(cur_00);
          }
          xVar1 = cur->type;
          if (xVar1 == XML_ELEMENT_NODE) {
LAB_0018e64c:
            cur_00 = (xmlNode *)0x0;
LAB_0018e64f:
            p_Var11 = cur->children;
            if ((p_Var11 == (_xmlNode *)0x0) ||
               ((p_Var11->type < XML_NAMESPACE_DECL &&
                ((0x20060U >> (p_Var11->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0))))
            goto LAB_0018e666;
          }
          else {
            cur_00 = (xmlNode *)0x0;
            if (xVar1 == XML_CDATA_SECTION_NODE) goto LAB_0018e64f;
            cur_00 = cur;
            if (xVar1 == XML_TEXT_NODE) {
              pbVar10 = cur->content;
              if (pbVar10 != (byte *)0x0) {
                for (; uVar22 = (ulong)*pbVar10, uVar22 < 0x21; pbVar10 = pbVar10 + 1) {
                  if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) {
                    if (uVar22 == 0) goto LAB_0018e635;
                    break;
                  }
                }
                goto LAB_0018e64c;
              }
LAB_0018e635:
              iVar8 = xmlNodeGetSpacePreserve(cur);
              cur_00 = (xmlNode *)0x0;
              if (iVar8 != 1) {
                cur_00 = cur;
              }
              goto LAB_0018e64f;
            }
LAB_0018e666:
            do {
              p_Var11 = cur->next;
              if (p_Var11 != (_xmlNode *)0x0) goto LAB_0018e67f;
              cur = cur->parent;
            } while ((cur != (xmlNodePtr)0x0) && (cur != node));
            p_Var11 = (_xmlNode *)0x0;
          }
LAB_0018e67f:
          cur = p_Var11;
        } while (p_Var11 != (_xmlNode *)0x0);
        if (cur_00 != (xmlNodePtr)0x0) {
          xmlUnlinkNode(cur_00);
          xmlFreeNode(cur_00);
        }
        pxVar19 = (xmlSchemaParserCtxtPtr)0x0;
        if (((node->ns == (xmlNs *)0x0) || (iVar8 = xmlStrEqual(node->name,"schema"), iVar8 == 0))
           || (iVar8 = xmlStrEqual(node->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
              iVar8 == 0)) {
          schemaBuffer = "The XML document \'%s\' is not a schema document";
          xVar20 = XML_SCHEMAP_NOT_SCHEMA;
          goto LAB_0018e7be;
        }
        local_48 = xmlSchemaGetProp(pctxt,node,"targetNamespace");
        iVar7 = 0;
      }
      if (iVar7 == 6) goto LAB_0018e9b3;
      iVar8 = 1;
      if (iVar7 != 0) goto LAB_0018ee66;
    }
    if ((bucket_00 == (xmlSchemaBucketPtr_conflict)0x0) && (iVar8 != 0)) {
      pxVar2 = pctxt->constructor->mainSchema;
      if (pxVar2 == (xmlSchemaPtr)0x0) {
        xmlSchemaInternalErr2
                  ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaBucketCreate",
                   "no main schema on constructor",(xmlChar *)0x0,(xmlChar *)schemaBuffer);
        bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
      }
      else {
        bucket_00 = (xmlSchemaBucketPtr_conflict)(*xmlMalloc)(0x58);
        if (bucket_00 == (xmlSchemaBucketPtr_conflict)0x0) {
          xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0x10,
                              (xmlError *)0x0);
          bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
        }
        else {
          bucket_00->origTargetNamespace = (xmlChar *)0x0;
          bucket_00->targetNamespace = (xmlChar *)0x0;
          bucket_00->type = 0;
          bucket_00->flags = 0;
          bucket_00->schemaLocation = (xmlChar *)0x0;
          bucket_00->globals = (xmlSchemaItemListPtr)0x0;
          bucket_00->locals = (xmlSchemaItemListPtr)0x0;
          bucket_00->located = 0;
          bucket_00->parsed = 0;
          bucket_00->imported = 0;
          bucket_00->preserveDoc = 0;
          bucket_00->doc = (xmlDocPtr)0x0;
          bucket_00->relations = (xmlSchemaSchemaRelationPtr_conflict)0x0;
          bucket_00[1].type = 0;
          bucket_00[1].flags = 0;
          bucket_00->targetNamespace = local_48;
          bucket_00->type = type;
          pxVar13 = xmlSchemaItemListCreate();
          bucket_00->globals = pxVar13;
          if (pxVar13 != (xmlSchemaItemListPtr)0x0) {
            pxVar13 = xmlSchemaItemListCreate();
            bucket_00->locals = pxVar13;
            if (pxVar13 != (xmlSchemaItemListPtr)0x0) {
              pxVar3 = pctxt->constructor;
              pxVar13 = pxVar3->buckets;
              if ((pxVar13 == (xmlSchemaItemListPtr)0x0) || (pxVar13->nbItems < 1)) {
                if ((type & 0xfffffffeU) != 2) {
                  bucket_00->type = 0;
                  pxVar3->mainBucket = bucket_00;
                  *(xmlSchemaPtr *)(bucket_00 + 1) = pxVar2;
                  pxVar17 = pxVar2;
LAB_0018ed53:
                  pxVar17->targetNamespace = local_48;
LAB_0018ed5c:
                  if ((uint)type < 2) {
                    if (pxVar2->schemasImports == (xmlHashTablePtr)0x0) {
                      pxVar18 = xmlHashCreateDict(5,pctxt->constructor->dict);
                      pxVar2->schemasImports = pxVar18;
                      if (pxVar18 == (xmlHashTablePtr)0x0) goto LAB_0018edcf;
                    }
                    pxVar15 = (xmlChar *)"##";
                    if (local_48 != (xmlChar *)0x0) {
                      pxVar15 = local_48;
                    }
                    iVar7 = xmlHashAddEntry(pxVar2->schemasImports,pxVar15,bucket_00);
                    if (iVar7 != 0) {
                      pcVar21 = "failed to add the schema bucket to the hash";
                      goto LAB_0018edc3;
                    }
                  }
                  else {
                    pxVar16 = pctxt->constructor->bucket;
                    if (1 < (uint)pxVar16->type) {
                      pxVar16 = *(xmlSchemaBucketPtr_conflict *)(pxVar16 + 1);
                    }
                    *(xmlSchemaBucketPtr_conflict *)(bucket_00 + 1) = pxVar16;
                    if (pxVar2->includes == (void *)0x0) {
                      pxVar13 = xmlSchemaItemListCreate();
                      pxVar2->includes = pxVar13;
                      if (pxVar13 == (xmlSchemaItemListPtr)0x0) goto LAB_0018edcf;
                    }
                    iVar7 = xmlSchemaItemListAddSize
                                      ((xmlSchemaItemListPtr)pxVar2->includes,0x14,bucket_00);
                    if (iVar7 < 0) goto LAB_0018edcf;
                  }
                  iVar7 = xmlSchemaItemListAddSize(pctxt->constructor->buckets,0x14,bucket_00);
                  if (iVar7 == -1) {
                    bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
                  }
                  goto LAB_0018edd9;
                }
                pcVar21 = "first bucket but it\'s an include or redefine";
              }
              else {
                if (type == 1) {
                  pxVar17 = xmlSchemaNewSchema(pctxt);
                  *(xmlSchemaPtr *)(bucket_00 + 1) = pxVar17;
                  if (pxVar17 != (xmlSchemaPtr)0x0) goto LAB_0018ed53;
                  goto LAB_0018edcf;
                }
                if (type != 0) goto LAB_0018ed5c;
                pcVar21 = "main bucket but it\'s not the first one";
              }
LAB_0018edc3:
              xmlSchemaInternalErr2
                        ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaBucketCreate",pcVar21,
                         (xmlChar *)0x0,(xmlChar *)schemaBuffer);
            }
          }
LAB_0018edcf:
          xmlSchemaBucketFree(bucket_00);
          bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
        }
      }
LAB_0018edd9:
      if (bucket_00 == (xmlSchemaBucketPtr_conflict)0x0) {
        bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
        goto LAB_0018ee46;
      }
    }
    if (bucket_00 == (xmlSchemaBucketPtr_conflict)0x0) {
      bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
    }
    else {
      bucket_00->schemaLocation = local_58;
      bucket_00->located = iVar8;
      if (local_60 != (xmlDoc *)0x0) {
        bucket_00->doc = local_60;
        bucket_00->targetNamespace = local_48;
        bucket_00->origTargetNamespace = local_48;
        if (schemaDoc != (xmlDocPtr)0x0) {
          bucket_00->preserveDoc = 1;
        }
      }
      if ((uint)type < 2) {
        bucket_00->imported = bucket_00->imported + 1;
      }
      if (pxVar12 != (xmlSchemaSchemaRelationPtr)0x0) goto LAB_0018ee2c;
    }
  }
  else {
    pxVar13 = pctxt->constructor->buckets;
    if ((pxVar13 == (xmlSchemaItemListPtr)0x0) || (pxVar13->nbItems < 1)) goto LAB_0018e3d4;
    xVar20 = *(xmlParserErrors *)(&DAT_001e1f90 + (long)type * 4);
    if (schemaLocation == (xmlChar *)0x0) {
LAB_0018e727:
      bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
LAB_0018e736:
      pxVar12 = (xmlSchemaSchemaRelationPtr)(*xmlMalloc)(0x20);
      if (pxVar12 == (xmlSchemaSchemaRelationPtr)0x0) {
        pxVar12 = (xmlSchemaSchemaRelationPtr)0x0;
        xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0x10,
                            (xmlError *)0x0);
        iVar8 = extraout_EDX_00;
      }
      else {
        pxVar12->importNamespace = (xmlChar *)0x0;
        pxVar12->bucket = (xmlSchemaBucketPtr)0x0;
        pxVar12->next = (xmlSchemaSchemaRelationPtr)0x0;
        *(undefined8 *)&pxVar12->type = 0;
        iVar8 = extraout_EDX;
      }
      if (pxVar12 == (xmlSchemaSchemaRelationPtr)0x0) {
        pxVar19 = (xmlSchemaParserCtxtPtr)0xffffffff;
        goto LAB_0018ee66;
      }
      pxVar16 = pctxt->constructor->bucket;
      pxVar4 = pxVar16->relations;
      if (pxVar4 == (xmlSchemaSchemaRelationPtr_conflict)0x0) {
        pxVar14 = (xmlSchemaSchemaRelationPtr_conflict)&pxVar16->relations;
      }
      else {
        do {
          pxVar14 = pxVar4;
          pxVar4 = pxVar14->next;
        } while (pxVar14->next != (xmlSchemaSchemaRelationPtr)0x0);
      }
      pxVar14->next = pxVar12;
      pxVar12->type = type;
      if (type == 1) {
        pxVar12->importNamespace = importNamespace;
        local_48 = importNamespace;
        if (schemaLocation == (xmlChar *)0x0) goto LAB_0018ee34;
      }
      else {
        local_48 = (xmlChar *)0x0;
      }
      if (bucket_00 != (xmlSchemaBucketPtr_conflict)0x0) {
        if (type == 1) {
          if (bucket_00->imported == 0) {
            if (schemaLocation == (xmlChar *)0x0) {
              schemaLocation = (xmlChar *)"in_memory_buffer";
            }
            iVar7 = xmlStrEqual(schemaLocation,bucket_00->schemaLocation);
            iVar8 = extraout_EDX_01;
            if (iVar7 == 0) {
              pcVar21 = 
              "The schema document \'%s\' cannot be imported, since it was already included or redefined"
              ;
              local_58 = schemaLocation;
LAB_0018eccd:
              xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pctxt,xVar20,invokingNode,
                                  (xmlSchemaBasicItemPtr)0x0,pcVar21,local_58,(xmlChar *)0x0,
                                  (xmlChar *)0x0,(xmlChar *)0x0);
              goto LAB_0018ee34;
            }
          }
        }
        else if (bucket_00->imported != 0) {
          if (schemaLocation == (xmlChar *)0x0) {
            schemaLocation = (xmlChar *)"in_memory_buffer";
          }
          iVar7 = xmlStrEqual(schemaLocation,bucket_00->schemaLocation);
          iVar8 = extraout_EDX_02;
          if (iVar7 == 0) {
            pcVar21 = 
            "The schema document \'%s\' cannot be included or redefined, since it was already imported"
            ;
            local_58 = schemaLocation;
            goto LAB_0018eccd;
          }
        }
      }
      if (type != 1) {
        if (bucket_00 == (xmlSchemaBucketPtr_conflict)0x0) {
          bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
        }
        else {
          if ((bucket_00->origTargetNamespace != (xmlChar *)0x0) ||
             (bucket_00->targetNamespace == sourceTargetNamespace)) goto LAB_0018ee2c;
          pxVar16 = xmlSchemaGetChameleonSchemaBucket(pctxt,schemaLocation,sourceTargetNamespace);
          if (pxVar16 != (xmlSchemaBucketPtr_conflict)0x0) {
            pxVar12->bucket = pxVar16;
            goto LAB_0018ee34;
          }
          bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
        }
LAB_0018ef17:
        if (bucket_00 == (xmlSchemaBucketPtr_conflict)0x0) {
          bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
          goto LAB_0018e3e2;
        }
        if (bucket_00->doc == (xmlDocPtr)0x0) goto LAB_0018e3e2;
        xmlSchemaInternalErr2
                  ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaAddSchemaDoc",
                   "trying to load a schema doc, but a doc is already assigned to the schema bucket"
                   ,(xmlChar *)0x0,(xmlChar *)schemaBuffer);
        goto LAB_0018e796;
      }
      if (bucket_00 == (xmlSchemaBucketPtr_conflict)0x0) {
        bucket_00 = xmlSchemaGetSchemaBucketByTNS(pctxt,importNamespace,iVar8);
        if (bucket_00 == (xmlSchemaBucketPtr_conflict)0x0) {
          bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
        }
        else {
          pxVar12->bucket = bucket_00;
          if (bucket_00->schemaLocation != (xmlChar *)0x0) {
            iVar8 = xmlStrEqual(schemaLocation,bucket_00->schemaLocation);
            if (iVar8 == 0) {
              pxVar15 = (xmlChar *)"in_memory_buffer";
              if (schemaLocation != (xmlChar *)0x0) {
                pxVar15 = schemaLocation;
              }
              xmlSchemaCustomWarning
                        ((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_WARN_SKIP_SCHEMA,invokingNode,
                         (xmlSchemaTypePtr)
                         "Skipping import of schema located at \'%s\' for the namespace \'%s\', since this namespace was already imported with the schema located at \'%s\'"
                         ,(char *)pxVar15,importNamespace,bucket_00->schemaLocation,
                         in_stack_ffffffffffffff60);
            }
            goto LAB_0018ee34;
          }
          bucket_00->schemaLocation = schemaLocation;
        }
        goto LAB_0018ef17;
      }
LAB_0018ee2c:
      pxVar12->bucket = bucket_00;
    }
    else {
      uVar22 = 0;
      do {
        bucket_00 = (xmlSchemaBucketPtr_conflict)pxVar13->items[uVar22];
        if (bucket_00->schemaLocation == schemaLocation) goto LAB_0018e3af;
        uVar22 = uVar22 + 1;
      } while ((uint)pxVar13->nbItems != uVar22);
      bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
LAB_0018e3af:
      if (bucket_00 == (xmlSchemaBucketPtr_conflict)0x0) goto LAB_0018e727;
      if (pctxt->constructor->bucket != bucket_00) goto LAB_0018e736;
      xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pctxt,xVar20,invokingNode,
                          (xmlSchemaBasicItemPtr)0x0,
                          "The schema must not import/include/redefine itself",(xmlChar *)0x0,
                          (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
    }
  }
LAB_0018ee34:
  pxVar19 = (xmlSchemaParserCtxtPtr)0x0;
  if (bucket != (xmlSchemaBucketPtr_conflict *)0x0) {
    *bucket = bucket_00;
  }
LAB_0018ee66:
  return (int)pxVar19;
}

Assistant:

static int
xmlSchemaAddSchemaDoc(xmlSchemaParserCtxtPtr pctxt,
		int type, /* import or include or redefine */
		const xmlChar *schemaLocation,
		xmlDocPtr schemaDoc,
		const char *schemaBuffer,
		int schemaBufferLen,
		xmlNodePtr invokingNode,
		const xmlChar *sourceTargetNamespace,
		const xmlChar *importNamespace,
		xmlSchemaBucketPtr *bucket)
{
    const xmlChar *targetNamespace = NULL;
    xmlSchemaSchemaRelationPtr relation = NULL;
    xmlDocPtr doc = NULL;
    int res = 0, err = 0, located = 0, preserveDoc = 0;
    xmlSchemaBucketPtr bkt = NULL;

    if (bucket != NULL)
	*bucket = NULL;

    switch (type) {
	case XML_SCHEMA_SCHEMA_IMPORT:
	case XML_SCHEMA_SCHEMA_MAIN:
	    err = XML_SCHEMAP_SRC_IMPORT;
	    break;
	case XML_SCHEMA_SCHEMA_INCLUDE:
	    err = XML_SCHEMAP_SRC_INCLUDE;
	    break;
	case XML_SCHEMA_SCHEMA_REDEFINE:
	    err = XML_SCHEMAP_SRC_REDEFINE;
	    break;
    }


    /* Special handling for the main schema:
    * skip the location and relation logic and just parse the doc.
    * We need just a bucket to be returned in this case.
    */
    if ((type == XML_SCHEMA_SCHEMA_MAIN) || (! WXS_HAS_BUCKETS(pctxt)))
	goto doc_load;

    /* Note that we expect the location to be an absolute URI. */
    if (schemaLocation != NULL) {
	bkt = xmlSchemaGetSchemaBucket(pctxt, schemaLocation);
	if ((bkt != NULL) &&
	    (pctxt->constructor->bucket == bkt)) {
	    /* Report self-imports/inclusions/redefinitions. */

	    xmlSchemaCustomErr(ACTXT_CAST pctxt, err,
		invokingNode, NULL,
		"The schema must not import/include/redefine itself",
		NULL, NULL);
	    goto exit;
	}
    }
    /*
    * Create a relation for the graph of schemas.
    */
    relation = xmlSchemaSchemaRelationCreate();
    if (relation == NULL)
	return(-1);
    xmlSchemaSchemaRelationAddChild(pctxt->constructor->bucket,
	relation);
    relation->type = type;

    /*
    * Save the namespace import information.
    */
    if (WXS_IS_BUCKET_IMPMAIN(type)) {
	relation->importNamespace = importNamespace;
	if (schemaLocation == NULL) {
	    /*
	    * No location; this is just an import of the namespace.
	    * Note that we don't assign a bucket to the relation
	    * in this case.
	    */
	    goto exit;
	}
	targetNamespace = importNamespace;
    }

    /* Did we already fetch the doc? */
    if (bkt != NULL) {
	if ((WXS_IS_BUCKET_IMPMAIN(type)) && (! bkt->imported)) {
	    /*
	    * We included/redefined and then try to import a schema,
	    * but the new location provided for import was different.
	    */
	    if (schemaLocation == NULL)
		schemaLocation = BAD_CAST "in_memory_buffer";
	    if (!xmlStrEqual(schemaLocation,
		bkt->schemaLocation)) {
		xmlSchemaCustomErr(ACTXT_CAST pctxt, err,
		    invokingNode, NULL,
		    "The schema document '%s' cannot be imported, since "
		    "it was already included or redefined",
		    schemaLocation, NULL);
		goto exit;
	    }
	} else if ((! WXS_IS_BUCKET_IMPMAIN(type)) && (bkt->imported)) {
	    /*
	    * We imported and then try to include/redefine a schema,
	    * but the new location provided for the include/redefine
	    * was different.
	    */
	    if (schemaLocation == NULL)
		schemaLocation = BAD_CAST "in_memory_buffer";
	    if (!xmlStrEqual(schemaLocation,
		bkt->schemaLocation)) {
		xmlSchemaCustomErr(ACTXT_CAST pctxt, err,
		    invokingNode, NULL,
		    "The schema document '%s' cannot be included or "
		    "redefined, since it was already imported",
		    schemaLocation, NULL);
		goto exit;
	    }
	}
    }

    if (WXS_IS_BUCKET_IMPMAIN(type)) {
	/*
	* Given that the schemaLocation [attribute] is only a hint, it is open
	* to applications to ignore all but the first <import> for a given
	* namespace, regardless of the `actual value` of schemaLocation, but
	* such a strategy risks missing useful information when new
	* schemaLocations are offered.
	*
	* We will use the first <import> that comes with a location.
	* Further <import>s *with* a location, will result in an error.
	* TODO: Better would be to just report a warning here, but
	* we'll try it this way until someone complains.
	*
	* Schema Document Location Strategy:
	* 3 Based on the namespace name, identify an existing schema document,
	* either as a resource which is an XML document or a <schema> element
	* information item, in some local schema repository;
	* 5 Attempt to resolve the namespace name to locate such a resource.
	*
	* NOTE: (3) and (5) are not supported.
	*/
	if (bkt != NULL) {
	    relation->bucket = bkt;
	    goto exit;
	}
	bkt = xmlSchemaGetSchemaBucketByTNS(pctxt,
	    importNamespace, 1);

	if (bkt != NULL) {
	    relation->bucket = bkt;
	    if (bkt->schemaLocation == NULL) {
		/* First given location of the schema; load the doc. */
		bkt->schemaLocation = schemaLocation;
	    } else {
		if (!xmlStrEqual(schemaLocation,
		    bkt->schemaLocation)) {
		    /*
		    * Additional location given; just skip it.
		    * URGENT TODO: We should report a warning here.
		    * res = XML_SCHEMAP_SRC_IMPORT;
		    */
		    if (schemaLocation == NULL)
			schemaLocation = BAD_CAST "in_memory_buffer";

		    xmlSchemaCustomWarning(ACTXT_CAST pctxt,
			XML_SCHEMAP_WARN_SKIP_SCHEMA,
			invokingNode, NULL,
			"Skipping import of schema located at '%s' for the "
			"namespace '%s', since this namespace was already "
			"imported with the schema located at '%s'",
			schemaLocation, importNamespace, bkt->schemaLocation);
		}
		goto exit;
	    }
	}
	/*
	* No bucket + first location: load the doc and create a
	* bucket.
	*/
    } else {
	/* <include> and <redefine> */
	if (bkt != NULL) {

	    if ((bkt->origTargetNamespace == NULL) &&
		(bkt->targetNamespace != sourceTargetNamespace)) {
		xmlSchemaBucketPtr chamel;

		/*
		* Chameleon include/redefine: skip loading only if it was
		* already build for the targetNamespace of the including
		* schema.
		*/
		/*
		* URGENT TODO: If the schema is a chameleon-include then copy
		* the components into the including schema and modify the
		* targetNamespace of those components, do nothing otherwise.
		* NOTE: This is currently worked-around by compiling the
		* chameleon for every distinct including targetNamespace; thus
		* not performant at the moment.
		* TODO: Check when the namespace in wildcards for chameleons
		* needs to be converted: before we built wildcard intersections
		* or after.
		*   Answer: after!
		*/
		chamel = xmlSchemaGetChameleonSchemaBucket(pctxt,
		    schemaLocation, sourceTargetNamespace);
		if (chamel != NULL) {
		    /* A fitting chameleon was already parsed; NOP. */
		    relation->bucket = chamel;
		    goto exit;
		}
		/*
		* We need to parse the chameleon again for a different
		* targetNamespace.
		* CHAMELEON TODO: Optimize this by only parsing the
		* chameleon once, and then copying the components to
		* the new targetNamespace.
		*/
		bkt = NULL;
	    } else {
		relation->bucket = bkt;
		goto exit;
	    }
	}
    }
    if ((bkt != NULL) && (bkt->doc != NULL)) {
	PERROR_INT("xmlSchemaAddSchemaDoc",
	    "trying to load a schema doc, but a doc is already "
	    "assigned to the schema bucket");
	goto exit_failure;
    }

doc_load:
    /*
    * Load the document.
    */
    if (schemaDoc != NULL) {
	doc = schemaDoc;
	/* Don' free this one, since it was provided by the caller. */
	preserveDoc = 1;
	/* TODO: Does the context or the doc hold the location? */
	if (schemaDoc->URL != NULL)
	    schemaLocation = xmlDictLookup(pctxt->dict,
		schemaDoc->URL, -1);
        else
	    schemaLocation = BAD_CAST "in_memory_buffer";
    } else if ((schemaLocation != NULL) || (schemaBuffer != NULL)) {
	xmlParserCtxtPtr parserCtxt;

	parserCtxt = xmlNewParserCtxt();
	if (parserCtxt == NULL) {
	    xmlSchemaPErrMemory(NULL);
	    goto exit_failure;
	}

        if (pctxt->serror != NULL)
            xmlCtxtSetErrorHandler(parserCtxt, pctxt->serror, pctxt->errCtxt);
        if (pctxt->resourceLoader != NULL)
            xmlCtxtSetResourceLoader(parserCtxt, pctxt->resourceLoader,
                                     pctxt->resourceCtxt);

	if ((pctxt->dict != NULL) && (parserCtxt->dict != NULL)) {
	    /*
	    * TODO: Do we have to burden the schema parser dict with all
	    * the content of the schema doc?
	    */
	    xmlDictFree(parserCtxt->dict);
	    parserCtxt->dict = pctxt->dict;
	    xmlDictReference(parserCtxt->dict);
	}
	if (schemaLocation != NULL) {
	    /* Parse from file. */
	    doc = xmlCtxtReadFile(parserCtxt, (const char *) schemaLocation,
		NULL, SCHEMAS_PARSE_OPTIONS);
	} else if (schemaBuffer != NULL) {
	    /* Parse from memory buffer. */
	    doc = xmlCtxtReadMemory(parserCtxt, schemaBuffer, schemaBufferLen,
		NULL, NULL, SCHEMAS_PARSE_OPTIONS);
	    schemaLocation = BAD_CAST "in_memory_buffer";
	    if (doc != NULL)
		doc->URL = xmlStrdup(schemaLocation);
	}
	/*
	* For <import>:
	* 2.1 The referent is (a fragment of) a resource which is an
	* XML document (see clause 1.1), which in turn corresponds to
	* a <schema> element information item in a well-formed information
	* set, which in turn corresponds to a valid schema.
	* TODO: (2.1) fragments of XML documents are not supported.
	*
	* 2.2 The referent is a <schema> element information item in
	* a well-formed information set, which in turn corresponds
	* to a valid schema.
	* TODO: (2.2) is not supported.
	*/
	if (doc == NULL) {
	    const xmlError *lerr;
	    lerr = xmlGetLastError();
	    /*
	    * Check if this a parser error, or if the document could
	    * just not be located.
	    * TODO: Try to find specific error codes to react only on
	    * localisation failures.
	    */
	    if ((lerr == NULL) || (lerr->domain != XML_FROM_IO)) {
		/*
		* We assume a parser error here.
		*/
		located = 1;
		/* TODO: Error code ?? */
		res = XML_SCHEMAP_SRC_IMPORT_2_1;
		xmlSchemaCustomErr(ACTXT_CAST pctxt, res,
		    invokingNode, NULL,
		    "Failed to parse the XML resource '%s'",
		    schemaLocation, NULL);
	    }
	}
	xmlFreeParserCtxt(parserCtxt);
	if ((doc == NULL) && located)
	    goto exit_error;
    } else {
	xmlSchemaPErr(pctxt, NULL,
	    XML_SCHEMAP_NOTHING_TO_PARSE,
	    "No information for parsing was provided with the "
	    "given schema parser context.\n",
	    NULL, NULL);
	goto exit_failure;
    }
    /*
    * Preprocess the document.
    */
    if (doc != NULL) {
	xmlNodePtr docElem = NULL;

	located = 1;
	docElem = xmlDocGetRootElement(doc);
	if (docElem == NULL) {
	    xmlSchemaCustomErr(ACTXT_CAST pctxt, XML_SCHEMAP_NOROOT,
		invokingNode, NULL,
		"The document '%s' has no document element",
		schemaLocation, NULL);
	    goto exit_error;
	}
	/*
	* Remove all the blank text nodes.
	*/
	xmlSchemaCleanupDoc(pctxt, docElem);
	/*
	* Check the schema's top level element.
	*/
	if (!IS_SCHEMA(docElem, "schema")) {
	    xmlSchemaCustomErr(ACTXT_CAST pctxt, XML_SCHEMAP_NOT_SCHEMA,
		invokingNode, NULL,
		"The XML document '%s' is not a schema document",
		schemaLocation, NULL);
	    goto exit_error;
	}
	/*
	* Note that we don't apply a type check for the
	* targetNamespace value here.
	*/
	targetNamespace = xmlSchemaGetProp(pctxt, docElem,
	    "targetNamespace");
    }

/* after_doc_loading: */
    if ((bkt == NULL) && located) {
	/* Only create a bucket if the schema was located. */
        bkt = xmlSchemaBucketCreate(pctxt, type,
	    targetNamespace);
	if (bkt == NULL)
	    goto exit_failure;
    }
    if (bkt != NULL) {
	bkt->schemaLocation = schemaLocation;
	bkt->located = located;
	if (doc != NULL) {
	    bkt->doc = doc;
	    bkt->targetNamespace = targetNamespace;
	    bkt->origTargetNamespace = targetNamespace;
	    if (preserveDoc)
		bkt->preserveDoc = 1;
	}
	if (WXS_IS_BUCKET_IMPMAIN(type))
	    bkt->imported++;
	    /*
	    * Add it to the graph of schemas.
	    */
	if (relation != NULL)
	    relation->bucket = bkt;
    }

exit:
    /*
    * Return the bucket explicitly; this is needed for the
    * main schema.
    */
    if (bucket != NULL)
	*bucket = bkt;
    return (0);

exit_error:
    if ((doc != NULL) && (! preserveDoc)) {
	xmlFreeDoc(doc);
	if (bkt != NULL)
	    bkt->doc = NULL;
    }
    return(pctxt->err);

exit_failure:
    if ((doc != NULL) && (! preserveDoc)) {
	xmlFreeDoc(doc);
	if (bkt != NULL)
	    bkt->doc = NULL;
    }
    return (-1);
}